

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

void __thiscall
soplex::SPxMainSM<double>::FixBoundsPS::FixBoundsPS
          (FixBoundsPS *this,SPxLPBase<double> *lp,int j,double val,
          shared_ptr<soplex::Tolerances> *tols)

{
  double dVar1;
  int iVar2;
  int iVar3;
  VarStatus VVar4;
  undefined8 *puVar5;
  long in_FS_OFFSET;
  Real RVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50 [16];
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_40 = (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38._M_pi =
       (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
    }
  }
  iVar2 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  iVar3 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_0069e680;
  (this->super_PostStep).m_name = "FixBounds";
  (this->super_PostStep).nCols = iVar3;
  (this->super_PostStep).nRows = iVar2;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_40;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_38);
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_0069eae0;
  this->m_j = j;
  dVar1 = (lp->super_LPColSetBase<double>).low.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[j];
  dVar8 = (lp->super_LPColSetBase<double>).up.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[j];
  RVar6 = Tolerances::floatingPointFeastol
                    ((this->super_PostStep)._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  dVar7 = ABS(dVar1);
  dVar9 = ABS(dVar8);
  if (dVar7 <= dVar9) {
    dVar7 = dVar9;
  }
  if (dVar7 <= 1.0) {
    dVar7 = 1.0;
  }
  VVar4 = FIXED;
  if (RVar6 < ABS((dVar1 - dVar8) / dVar7)) {
    dVar1 = (lp->super_LPColSetBase<double>).low.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[j];
    (*(this->super_PostStep)._vptr_PostStep[6])(this);
    dVar7 = ABS(val);
    dVar9 = ABS(dVar1);
    dVar8 = dVar7;
    if (dVar7 <= dVar9) {
      dVar8 = dVar9;
    }
    if (dVar8 <= 1.0) {
      dVar8 = 1.0;
    }
    VVar4 = ON_LOWER;
    if (extraout_XMM0_Qa < ABS((val - dVar1) / dVar8)) {
      dVar1 = (lp->super_LPColSetBase<double>).up.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[j];
      (*(this->super_PostStep)._vptr_PostStep[6])(this);
      dVar8 = ABS(dVar1);
      if (dVar7 <= dVar8) {
        dVar7 = dVar8;
      }
      if (dVar7 <= 1.0) {
        dVar7 = 1.0;
      }
      VVar4 = ON_UPPER;
      if (extraout_XMM0_Qa_00 < ABS((val - dVar1) / dVar7)) {
        dVar1 = (lp->super_LPColSetBase<double>).low.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[j];
        ::soplex::infinity::__tls_init();
        dVar8 = *(double *)(in_FS_OFFSET + -8);
        if (dVar1 <= -dVar8) {
          dVar1 = (lp->super_LPColSetBase<double>).up.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[j];
          ::soplex::infinity::__tls_init();
          VVar4 = ZERO;
          if (dVar8 <= dVar1) goto LAB_001f983d;
        }
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
        local_60 = local_50;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"XMAISM14 This should never happen.","");
        *puVar5 = &PTR__SPxException_0069d438;
        puVar5[1] = puVar5 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar5 + 1),local_60,local_60 + local_58);
        *puVar5 = &PTR__SPxException_0069d410;
        __cxa_throw(puVar5,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
    }
  }
LAB_001f983d:
  this->m_status = VVar4;
  return;
}

Assistant:

FixBoundsPS(const SPxLPBase<R>& lp, int j, R val, std::shared_ptr<Tolerances> tols)
         : PostStep("FixBounds", tols, lp.nRows(), lp.nCols())
         , m_j(j)
      {
         if(EQrel(lp.lower(j), lp.upper(j), this->feastol()))
            m_status = SPxSolverBase<R>::FIXED;
         else if(EQrel(val, lp.lower(j), this->feastol()))
            m_status = SPxSolverBase<R>::ON_LOWER;
         else if(EQrel(val, lp.upper(j), this->feastol()))
            m_status = SPxSolverBase<R>::ON_UPPER;
         else if(lp.lower(j) <= R(-infinity) && lp.upper(j) >= R(infinity))
            m_status = SPxSolverBase<R>::ZERO;
         else
         {
            throw SPxInternalCodeException("XMAISM14 This should never happen.");
         }
      }